

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb<int,_false,_6>_> * __thiscall
immutable::ref<immutable::rrb<int,_false,_6>_>::operator=
          (ref<immutable::rrb<int,_false,_6>_> *this,ref<immutable::rrb<int,_false,_6>_> *r)

{
  ref<immutable::rrb<int,_false,_6>_> local_20;
  ref<immutable::rrb<int,_false,_6>_> temp;
  ref<immutable::rrb<int,_false,_6>_> *r_local;
  ref<immutable::rrb<int,_false,_6>_> *this_local;
  
  temp.ptr = (rrb<int,_false,_6> *)r;
  ref(&local_20,r);
  swap(this,&local_20);
  ~ref(&local_20);
  return this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<T>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }